

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QScore.h
# Opt level: O0

void __thiscall FASTQ::QScore::PrecomputeScores(QScore *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double p;
  double local_40;
  double pmm;
  double pm;
  double py;
  int qy;
  double px;
  int qx;
  QScore *this_local;
  
  for (px._4_4_ = 0; px._4_4_ < 0x2a; px._4_4_ = px._4_4_ + 1) {
    dVar2 = ScoreToProbability(this,px._4_4_);
    for (py._4_4_ = 0; py._4_4_ < 0x2a; py._4_4_ = py._4_4_ + 1) {
      dVar3 = ScoreToProbability(this,py._4_4_);
      p = ((dVar2 * dVar3) / 3.0) / (((1.0 - dVar2) - dVar3) + (dVar2 * 4.0 * dVar3) / 3.0);
      if (dVar3 <= dVar2) {
        local_40 = (dVar3 * (1.0 - dVar2 / 3.0)) / ((dVar2 + dVar3) - (dVar2 * 4.0 * dVar3) / 3.0);
      }
      else {
        local_40 = (dVar2 * (1.0 - dVar3 / 3.0)) / ((dVar2 + dVar3) - (dVar2 * 4.0 * dVar3) / 3.0);
      }
      this->mPosteriorErrorProbabilitiesForMatch[px._4_4_][py._4_4_] = p;
      this->mPosteriorErrorProbabilitiesForMismatch[px._4_4_][py._4_4_] = local_40;
      iVar1 = ProbabilityToScore(this,p);
      this->mPosteriorScoresForMatch[px._4_4_][py._4_4_] = iVar1;
      iVar1 = ProbabilityToScore(this,local_40);
      this->mPosteriorScoresForMismatch[px._4_4_][py._4_4_] = iVar1;
    }
  }
  return;
}

Assistant:

void PrecomputeScores() {
    for( int qx = 0; qx <= Q_MAX_SCORE; qx++ ) {
      double px = ScoreToProbability( qx );

      for( int qy = 0; qy <= Q_MAX_SCORE; qy++ ) {
        double py = ScoreToProbability( qy );

        double pm = ( px * py / 3.0 ) /
                    ( 1.0 - px - py + 4.0 * px * py / 3.0 ); // (8) in paper

        double pmm;
        if( px < py ) {
          // px < py: merged base is X
          pmm = px * ( 1.0 - py / 3.0 ) /
                ( px + py - 4.0 * px * py / 3.0 ); // (9) in paper
        } else {
          // py < px: merged base is Y
          pmm = py * ( 1.0 - px / 3.0 ) /
                ( px + py - 4.0 * px * py / 3.0 ); // (9) in paper
        }

        mPosteriorErrorProbabilitiesForMatch[ qx ][ qy ]    = pm;
        mPosteriorErrorProbabilitiesForMismatch[ qx ][ qy ] = pmm;

        mPosteriorScoresForMatch[ qx ][ qy ]    = ProbabilityToScore( pm );
        mPosteriorScoresForMismatch[ qx ][ qy ] = ProbabilityToScore( pmm );
      }
    }
  }